

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void literal_suite::test_string(void)

{
  size_t in_RCX;
  void *__buf;
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1d4;
  undefined8 local_1d0;
  char *local_1c8;
  ssize_t local_1b0;
  undefined **local_1a8 [5];
  ostringstream local_180 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8[0] = &PTR__base_00114b78;
  local_1d0 = 5;
  local_1c8 = "alpha";
  local_1a8[1] = (undefined **)local_180;
  local_1b0 = trial::protocol::json::detail::basic_encoder<char,_24UL>::write
                        ((basic_encoder<char,_24UL> *)local_1a8,(int)&local_1d0,__buf,in_RCX);
  local_1d4 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.literal(\"alpha\")","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3e5,"void literal_suite::test_string()",&local_1b0,&local_1d4);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result.str()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3e6,"void literal_suite::test_string()",&local_1d0,"alpha");
  std::__cxx11::string::~string((string *)&local_1d0);
  (*(code *)*local_1a8[0])();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_string()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.literal("alpha"), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "alpha");
}